

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int flatcc_builder_start_table(flatcc_builder_t *B,int count)

{
  int iVar1;
  int count_local;
  flatcc_builder_t *B_local;
  
  iVar1 = enter_frame(B,4);
  if (iVar1 == 0) {
    (B->frame->container).table.vs_end = (int)B->vs - (int)B->buffers[0].iov_base;
    (B->frame->container).table.pl_end = (int)B->pl - (int)B->buffers[3].iov_base;
    (B->frame->container).table.vt_hash = B->vt_hash;
    (B->frame->container).table.id_end = B->id_end;
    B->vt_hash = 0;
    B->vt_hash = 0x2f693b52;
    B->id_end = 0;
    B->frame->type = 3;
    iVar1 = reserve_fields(B,count);
    if (iVar1 == 0) {
      refresh_ds(B,0xfffc);
      B_local._4_4_ = 0;
    }
    else {
      B_local._4_4_ = -1;
    }
  }
  else {
    B_local._4_4_ = -1;
  }
  return B_local._4_4_;
}

Assistant:

int flatcc_builder_start_table(flatcc_builder_t *B, int count)
{
    if (enter_frame(B, field_size)) {
        return -1;
    }
    frame(container.table.vs_end) = vs_offset(B->vs);
    frame(container.table.pl_end) = pl_offset(B->pl);
    frame(container.table.vt_hash) = B->vt_hash;
    frame(container.table.id_end) = B->id_end;
    B->vt_hash = 0;
    FLATCC_BUILDER_INIT_VT_HASH(B->vt_hash);
    B->id_end = 0;
    frame(type) = flatcc_builder_table;
    if (reserve_fields(B, count)) {
        return -1;
    }
    refresh_ds(B, table_limit);
    return 0;
}